

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int calc_active_best_quality_no_stats_cbr
              (AV1_COMP *cpi,int active_worst_quality,int width,int height)

{
  long lVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  double qstart;
  FRAME_TYPE frame_type;
  int q;
  double q_val;
  double q_adj_factor;
  int delta_qindex;
  double last_boosted_q;
  int qindex;
  int active_best_quality;
  int bit_depth;
  int *rtc_minq;
  CurrentFrame *current_frame;
  RefreshFrameInfo *refresh_frame;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  aom_bit_depth_t in_stack_ffffffffffffff78;
  aom_bit_depth_t bit_depth_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  double in_stack_ffffffffffffff88;
  RATE_CONTROL *in_stack_ffffffffffffff90;
  RATE_CONTROL *rc_00;
  int local_50;
  int *local_48;
  
  lVar1 = *in_RDI;
  bit_depth_00 = *(aom_bit_depth_t *)(in_RDI[0x8401] + 0x48);
  local_50 = (int)in_RDI[0xc106];
  if (bit_depth_00 == AOM_BITS_8) {
    local_48 = rtc_minq_8;
  }
  else if (bit_depth_00 == AOM_BITS_10) {
    local_48 = rtc_minq_10;
  }
  else if (bit_depth_00 == AOM_BITS_12) {
    local_48 = rtc_minq_12;
  }
  else {
    local_48 = (int *)0x0;
  }
  iVar2 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x77f0));
  if (iVar2 == 0) {
    if (((((int)in_RDI[0xc0f5] == 0) && (*(int *)(*in_RDI + 0xc750) == 0)) &&
        (*(int *)((long)in_RDI + 0x423bc) != 0)) &&
       (((*(byte *)(in_RDI + 0x85af) & 1) != 0 || ((*(byte *)((long)in_RDI + 0x42d7a) & 1) != 0))))
    {
      if ((1 < (int)in_RDI[0xc0f4]) && (*(int *)(lVar1 + 0xacc0) < in_ESI)) {
        in_ESI = *(int *)(lVar1 + 0xacc0);
      }
      local_50 = get_gf_active_quality
                           ((PRIMARY_RATE_CONTROL *)CONCAT44(in_ESI,in_stack_ffffffffffffff80),
                            bit_depth_00,in_stack_ffffffffffffff78);
    }
    else if (*(int *)(lVar1 + 0xacbc + (ulong)(1 < *(uint *)(in_RDI + 0x77f2)) * 4) < in_ESI) {
      local_50 = local_48[*(int *)(lVar1 + 0xacbc + (ulong)(1 < *(uint *)(in_RDI + 0x77f2)) * 4)];
    }
    else {
      local_50 = local_48[in_ESI];
    }
  }
  else if (*(int *)(lVar1 + 0xac68) == 0) {
    if ((int)in_RDI[0x77f2] != 0) {
      rc_00 = (RATE_CONTROL *)0x3ff0000000000000;
      iVar2 = get_kf_active_quality
                        ((PRIMARY_RATE_CONTROL *)0x3ff0000000000000,
                         (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                         SUB84(in_stack_ffffffffffffff88,0));
      if (in_EDX * in_ECX < 0x18c01) {
        rc_00 = (RATE_CONTROL *)((double)rc_00 - 0.25);
      }
      qstart = av1_convert_qindex_to_q(bit_depth_00,in_stack_ffffffffffffff78);
      local_50 = av1_compute_qdelta(rc_00,qstart,
                                    (double)CONCAT44(in_stack_ffffffffffffff84,
                                                     in_stack_ffffffffffffff80),bit_depth_00);
      local_50 = local_50 + iVar2;
    }
  }
  else {
    local_50 = *(int *)(lVar1 + 0xace8);
    av1_convert_qindex_to_q(bit_depth_00,in_stack_ffffffffffffff78);
    iVar2 = av1_compute_qdelta(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                               (double)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                               ,bit_depth_00);
    if ((int)in_RDI[0xc106] < local_50 + iVar2) {
      local_50 = local_50 + iVar2;
    }
    else {
      local_50 = (int)in_RDI[0xc106];
    }
  }
  return local_50;
}

Assistant:

static int calc_active_best_quality_no_stats_cbr(const AV1_COMP *cpi,
                                                 int active_worst_quality,
                                                 int width, int height) {
  const AV1_COMMON *const cm = &cpi->common;
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const RefreshFrameInfo *const refresh_frame = &cpi->refresh_frame;
  const CurrentFrame *const current_frame = &cm->current_frame;
  int *rtc_minq;
  const int bit_depth = cm->seq_params->bit_depth;
  int active_best_quality = rc->best_quality;
  ASSIGN_MINQ_TABLE(bit_depth, rtc_minq);

  if (frame_is_intra_only(cm)) {
    // Handle the special case for key frames forced when we have reached
    // the maximum key frame interval. Here force the Q to a range
    // based on the ambient Q to reduce the risk of popping.
    if (p_rc->this_key_frame_forced) {
      int qindex = p_rc->last_boosted_qindex;
      double last_boosted_q = av1_convert_qindex_to_q(qindex, bit_depth);
      int delta_qindex = av1_compute_qdelta(rc, last_boosted_q,
                                            (last_boosted_q * 0.75), bit_depth);
      active_best_quality = AOMMAX(qindex + delta_qindex, rc->best_quality);
    } else if (current_frame->frame_number > 0) {
      // not first frame of one pass and kf_boost is set
      double q_adj_factor = 1.0;
      double q_val;
      active_best_quality = get_kf_active_quality(
          p_rc, p_rc->avg_frame_qindex[KEY_FRAME], bit_depth);
      // Allow somewhat lower kf minq with small image formats.
      if ((width * height) <= (352 * 288)) {
        q_adj_factor -= 0.25;
      }
      // Convert the adjustment factor to a qindex delta
      // on active_best_quality.
      q_val = av1_convert_qindex_to_q(active_best_quality, bit_depth);
      active_best_quality +=
          av1_compute_qdelta(rc, q_val, q_val * q_adj_factor, bit_depth);
    }
  } else if (!rc->is_src_frame_alt_ref && !cpi->ppi->use_svc &&
             cpi->oxcf.rc_cfg.gf_cbr_boost_pct &&
             (refresh_frame->golden_frame || refresh_frame->alt_ref_frame)) {
    // Use the lower of active_worst_quality and recent
    // average Q as basis for GF/ARF best Q limit unless last frame was
    // a key frame.
    int q = active_worst_quality;
    if (rc->frames_since_key > 1 &&
        p_rc->avg_frame_qindex[INTER_FRAME] < active_worst_quality) {
      q = p_rc->avg_frame_qindex[INTER_FRAME];
    }
    active_best_quality = get_gf_active_quality(p_rc, q, bit_depth);
  } else {
    // Use the lower of active_worst_quality and recent/average Q.
    FRAME_TYPE frame_type =
        (current_frame->frame_number > 1) ? INTER_FRAME : KEY_FRAME;
    if (p_rc->avg_frame_qindex[frame_type] < active_worst_quality)
      active_best_quality = rtc_minq[p_rc->avg_frame_qindex[frame_type]];
    else
      active_best_quality = rtc_minq[active_worst_quality];
  }
  return active_best_quality;
}